

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

bool duckdb_yyjson::is_truncated_end
               (u8 *hdr,u8 *cur,u8 *end,yyjson_read_code code,yyjson_read_flag flg)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  u8 *puVar6;
  bool bVar7;
  ulong uVar8;
  bool bVar9;
  
  if (end <= cur) {
    return true;
  }
  if ((code == 6) || (code == 9)) {
LAB_0126f817:
    if ((flg & 0x10) != 0) {
      puVar6 = cur + (ulong)(*cur == '-') + 8;
      cur = cur + (*cur == '-');
      if (cur < end && end < puVar6) {
        lVar4 = 0;
        while( true ) {
          if ((cur[lVar4] != "Bar width must not be NaN or infinity"[lVar4 + 0x1d]) &&
             ((byte)"Bar width must not be NaN or infinity"[lVar4 + 0x1d] - 0x20 != (uint)cur[lVar4]
             )) break;
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          if (end <= cur + lVar2) {
            return true;
          }
        }
      }
      if (end < cur + 3 && cur < end) {
        lVar4 = 0;
        while( true ) {
          if ((cur[lVar4] != "-nan"[lVar4 + 1]) &&
             ((byte)"-nan"[lVar4 + 1] - 0x20 != (uint)cur[lVar4])) break;
          lVar2 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          if (end <= cur + lVar2) {
            return true;
          }
        }
      }
    }
  }
  else if (code == 0xb) {
    if ((end < cur + 4) && (iVar3 = bcmp(cur,"true",(long)end - (long)cur), iVar3 == 0)) {
      return true;
    }
    if ((end < cur + 5) && (iVar3 = bcmp(cur,"false",(long)end - (long)cur), iVar3 == 0)) {
      return true;
    }
    if ((end < cur + 4) && (iVar3 = bcmp(cur,"null",(long)end - (long)cur), iVar3 == 0)) {
      return true;
    }
    goto LAB_0126f817;
  }
  if (code != 10) {
    if (code != 4) {
      return false;
    }
    if ((flg & 0x10) == 0) {
      return false;
    }
    if (cur < hdr + 3) {
      return false;
    }
    if (end <= cur + -3 || cur + 5 <= end) {
      return false;
    }
    puVar6 = (u8 *)0x0;
    while( true ) {
      bVar5 = (cur + -3)[(long)puVar6];
      if ((bVar5 != "Bar width must not be NaN or infinity"[(long)(puVar6 + 0x1d)]) &&
         ((byte)"Bar width must not be NaN or infinity"[(long)(puVar6 + 0x1d)] - 0x20 != (uint)bVar5
         )) break;
      puVar6 = puVar6 + 1;
      if (end + (3 - (long)cur) == puVar6) {
        return true;
      }
    }
    return false;
  }
  uVar8 = (long)end - (long)cur;
  bVar5 = *cur;
  if (bVar5 == 0x5c) {
    bVar7 = true;
    if (uVar8 != 1) {
      if ((5 < uVar8) || (cur[1] != 0x75)) {
        bVar1 = false;
        bVar7 = false;
        goto LAB_0126f99b;
      }
      if (cur + 2 < end) {
        lVar4 = 0;
        do {
          bVar7 = (bool)((byte)char_table[(cur + 2)[lVar4]] >> 7);
          bVar1 = false;
          if (-1 < (char)char_table[(cur + 2)[lVar4]]) break;
          bVar9 = uVar8 - 3 != lVar4;
          lVar4 = lVar4 + 1;
        } while (bVar9);
        goto LAB_0126f99b;
      }
    }
LAB_0126f859:
    bVar1 = false;
  }
  else {
    if (((char)bVar5 < '\0') && (uVar8 != 3)) {
      if (uVar8 == 2) {
        if ((cur[1] & 0xc0) == 0x80 && (bVar5 & 0xf0) == 0xe0) {
          bVar5 = cur[1] >> 5 & 1 | bVar5 * '\x02' & 0x1e;
          bVar7 = bVar5 != 0x1b && bVar5 != 0;
          goto LAB_0126f859;
        }
      }
      else if (uVar8 == 1) {
        bVar7 = true;
        if ((((bVar5 & 0xf0) == 0xe0) || ((bVar5 & 0xe0) == 0xc0 && (bVar5 & 0x1e) != 0)) ||
           ((bVar5 & 0xf8) == 0xf0 && (bVar5 & 7) < 5)) goto LAB_0126f859;
      }
    }
    bVar7 = true;
    bVar1 = true;
  }
LAB_0126f99b:
  if (bVar1) {
    return false;
  }
  return bVar7;
}

Assistant:

static_noinline bool is_truncated_end(u8 *hdr, u8 *cur, u8 *end,
                                      yyjson_read_code code,
                                      yyjson_read_flag flg) {
    if (cur >= end) return true;
    if (code == YYJSON_READ_ERROR_LITERAL) {
        if (is_truncated_str(cur, end, "true", true) ||
            is_truncated_str(cur, end, "false", true) ||
            is_truncated_str(cur, end, "null", true)) {
            return true;
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CHARACTER ||
        code == YYJSON_READ_ERROR_INVALID_NUMBER ||
        code == YYJSON_READ_ERROR_LITERAL) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (*cur == '-') cur++;
            if (is_truncated_str(cur, end, "infinity", false) ||
                is_truncated_str(cur, end, "nan", false)) {
                return true;
            }
        }
    }
    if (code == YYJSON_READ_ERROR_UNEXPECTED_CONTENT) {
        if (has_read_flag(ALLOW_INF_AND_NAN)) {
            if (hdr + 3 <= cur &&
                is_truncated_str(cur - 3, end, "infinity", false)) {
                return true; /* e.g. infin would be read as inf + in */
            }
        }
    }
    if (code == YYJSON_READ_ERROR_INVALID_STRING) {
        usize len = (usize)(end - cur);

        /* unicode escape sequence */
        if (*cur == '\\') {
            if (len == 1) return true;
            if (len <= 5) {
                if (*++cur != 'u') return false;
                for (++cur; cur < end; cur++) {
                    if (!char_is_hex(*cur)) return false;
                }
                return true;
            }
            return false;
        }

        /* 2 to 4 bytes UTF-8, see `read_string()` for details. */
        if (*cur & 0x80) {
            u8 c0 = cur[0], c1 = cur[1], c2 = cur[2];
            if (len == 1) {
                /* 2 bytes UTF-8, truncated */
                if ((c0 & 0xE0) == 0xC0 && (c0 & 0x1E) != 0x00) return true;
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0) return true;
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 && (c0 & 0x07) <= 0x04) return true;
            }
            if (len == 2) {
                /* 3 bytes UTF-8, truncated */
                if ((c0 & 0xF0) == 0xE0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x0F) << 1) | ((c1 & 0x20) >> 5));
                    return 0x01 <= pat && pat != 0x1B;
                }
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
            if (len == 3) {
                /* 4 bytes UTF-8, truncated */
                if ((c0 & 0xF8) == 0xF0 &&
                    (c1 & 0xC0) == 0x80 &&
                    (c2 & 0xC0) == 0x80) {
                    u8 pat = (u8)(((c0 & 0x07) << 2) | ((c1 & 0x30) >> 4));
                    return 0x01 <= pat && pat <= 0x10;
                }
            }
        }
    }
    return false;
}